

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagStackFrame.cpp
# Opt level: O3

void __thiscall
Js::DiagStackFrame::EvaluateImmediate
          (DiagStackFrame *this,char16 *source,int sourceLength,BOOL isLibraryCode,
          ResolvedObject *resolvedObject)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  ScriptFunction *pfuncScript;
  undefined4 extraout_var_00;
  FunctionBody *pFVar3;
  undefined4 extraout_var_01;
  Var pvVar4;
  
  TryFetchValueAndAddress(this,source,sourceLength,resolvedObject);
  if (resolvedObject->obj == (Var)0x0) {
    iVar1 = (*this->_vptr_DiagStackFrame[10])(this);
    pfuncScript = TryGetFunctionForEval
                            (this,(ScriptContext *)CONCAT44(extraout_var,iVar1),source,sourceLength,
                             isLibraryCode);
    if (pfuncScript != (ScriptFunction *)0x0) {
      iVar1 = (*this->_vptr_DiagStackFrame[2])(this);
      pFVar3 = JavascriptFunction::GetFunctionBody
                         ((JavascriptFunction *)CONCAT44(extraout_var_00,iVar1));
      if ((pFVar3 == (FunctionBody *)0x0) ||
         (((pFVar3->super_ParseableFunctionInfo).flags & Flags_NonUserCode) != Flags_None)) {
        pFVar3 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)pfuncScript);
        if (pFVar3 != (FunctionBody *)0x0) {
          ParseableFunctionInfo::SetIsNonUserCode(&pFVar3->super_ParseableFunctionInfo,true);
        }
      }
      iVar1 = (*this->_vptr_DiagStackFrame[2])(this);
      uVar2 = JavascriptFunction::IsStrictMode
                        ((JavascriptFunction *)CONCAT44(extraout_var_01,iVar1));
      Output::Trace(ConsoleScopePhase,
                    L"EvaluateImmediate strict = %d, libraryCode = %d, source = \'%s\'\n",
                    (ulong)uVar2,(ulong)(uint)isLibraryCode,source);
      pvVar4 = DoEval(this,pfuncScript);
      resolvedObject->obj = pvVar4;
    }
  }
  return;
}

Assistant:

void DiagStackFrame::EvaluateImmediate(const char16 *source, int sourceLength, BOOL isLibraryCode, Js::ResolvedObject * resolvedObject)
    {
        this->TryFetchValueAndAddress(source, sourceLength, resolvedObject);

        if (resolvedObject->obj == nullptr)
        {
            Js::ScriptFunction* pfuncScript = this->TryGetFunctionForEval(this->GetScriptContext(), source, sourceLength, isLibraryCode);
            if (pfuncScript != nullptr)
            {
                // Passing the nonuser code state from the enclosing function to the current function.
                // Treat native library frame (no function body) as non-user code.
                Js::FunctionBody* body = this->GetFunction();
                if (!body || body->IsNonUserCode())
                {
                    Js::FunctionBody *pCurrentFuncBody = pfuncScript->GetFunctionBody();
                    if (pCurrentFuncBody != nullptr)
                    {
                        pCurrentFuncBody->SetIsNonUserCode(true);
                    }
                }
                OUTPUT_TRACE(Js::ConsoleScopePhase, _u("EvaluateImmediate strict = %d, libraryCode = %d, source = '%s'\n"),
                    this->IsStrictMode(), isLibraryCode, source);
                resolvedObject->obj = this->DoEval(pfuncScript);
            }
        }
    }